

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O0

void CalcExpression(void)

{
  tokentype tokopnd;
  int tabindex;
  tokentype tokopnd_00;
  addressrec aVar1;
  addressrec op3_00;
  addressrec op3;
  addressrec op2;
  addressrec op1;
  optype optor;
  tokentype tokopnd2;
  tokentype tokopnd1;
  tokentype tokoptor;
  
  op1.opndtype = opnvar;
  tokopnd = actionpop();
  tabindex = actionpop();
  tokopnd_00 = actionpop();
  if (tabindex == 0x16) {
    op1.opndtype = opntempvar;
  }
  else if (tabindex == 0x17) {
    op1.opndtype = opnconst;
  }
  else {
    printlexeme(tabindex);
    error(" is an invalid operator",linenum);
  }
  aVar1 = getaddress(tokopnd_00);
  op3_00 = getaddress(tokopnd);
  aVar1 = GenArithQuad(aVar1,op1.opndtype,op3_00);
  op2.opnd = aVar1.opnd;
  actionpush(op2.opnd);
  didcalculation = 1;
  return;
}

Assistant:

void	CalcExpression(void)
{
    enum tokentype		tokoptor, tokopnd1, tokopnd2;
    enum optype		optor = opnull;
    struct addressrec	op1, op2, op3;
    
    tokopnd2 = actionpop();
    tokoptor = actionpop();
    tokopnd1 = actionpop();
    
    switch(tokoptor)	{
        case tokplus:		optor = opadd; break;
        case tokminus:	optor = opsub;	break;
        default:	printlexeme(tokoptor);
            error(" is an invalid operator", linenum);
    }
    
    op2 = getaddress(tokopnd1);
    op3 = getaddress(tokopnd2);
    
    op1 = GenArithQuad(op2, optor, op3);
    actionpush(op1.opnd);
    
    didcalculation = YES;
}